

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkPipelineColorBlendAttachmentState *
Diligent::RenderTargetBlendDescToVkColorBlendAttachmentState
          (VkPipelineColorBlendAttachmentState *__return_storage_ptr__,
          RenderTargetBlendDesc *RTBlendDesc)

{
  int iVar1;
  VkBlendFactor VVar2;
  VkBlendOp VVar3;
  VkColorComponentFlags VVar4;
  RenderTargetBlendDesc *RTBlendDesc_local;
  
  if (RenderTargetBlendDescToVkColorBlendAttachmentState(Diligent::RenderTargetBlendDesc_const&)::
      BFtoVKBF == '\0') {
    iVar1 = __cxa_guard_acquire(&RenderTargetBlendDescToVkColorBlendAttachmentState(Diligent::RenderTargetBlendDesc_const&)
                                 ::BFtoVKBF);
    if (iVar1 != 0) {
      BlendFactorToVkBlendFactorMapper::BlendFactorToVkBlendFactorMapper
                (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF);
      __cxa_guard_release(&RenderTargetBlendDescToVkColorBlendAttachmentState(Diligent::RenderTargetBlendDesc_const&)
                           ::BFtoVKBF);
    }
  }
  if (RenderTargetBlendDescToVkColorBlendAttachmentState(Diligent::RenderTargetBlendDesc_const&)::
      BOtoVKBO == '\0') {
    iVar1 = __cxa_guard_acquire(&RenderTargetBlendDescToVkColorBlendAttachmentState(Diligent::RenderTargetBlendDesc_const&)
                                 ::BOtoVKBO);
    if (iVar1 != 0) {
      BlendOperationToVkBlendOp::BlendOperationToVkBlendOp
                (&RenderTargetBlendDescToVkColorBlendAttachmentState::BOtoVKBO);
      __cxa_guard_release(&RenderTargetBlendDescToVkColorBlendAttachmentState(Diligent::RenderTargetBlendDesc_const&)
                           ::BOtoVKBO);
    }
  }
  memset(__return_storage_ptr__,0,0x20);
  __return_storage_ptr__->blendEnable = (uint)(RTBlendDesc->BlendEnable & 1);
  VVar2 = BlendFactorToVkBlendFactorMapper::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF,
                     RTBlendDesc->SrcBlend);
  __return_storage_ptr__->srcColorBlendFactor = VVar2;
  VVar2 = BlendFactorToVkBlendFactorMapper::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF,
                     RTBlendDesc->DestBlend);
  __return_storage_ptr__->dstColorBlendFactor = VVar2;
  VVar3 = BlendOperationToVkBlendOp::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BOtoVKBO,
                     RTBlendDesc->BlendOp);
  __return_storage_ptr__->colorBlendOp = VVar3;
  VVar2 = BlendFactorToVkBlendFactorMapper::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF,
                     RTBlendDesc->SrcBlendAlpha);
  __return_storage_ptr__->srcAlphaBlendFactor = VVar2;
  VVar2 = BlendFactorToVkBlendFactorMapper::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BFtoVKBF,
                     RTBlendDesc->DestBlendAlpha);
  __return_storage_ptr__->dstAlphaBlendFactor = VVar2;
  VVar3 = BlendOperationToVkBlendOp::operator[]
                    (&RenderTargetBlendDescToVkColorBlendAttachmentState::BOtoVKBO,
                     RTBlendDesc->BlendOpAlpha);
  __return_storage_ptr__->alphaBlendOp = VVar3;
  VVar4 = ColorMaskToVkColorComponentFlags(RTBlendDesc->RenderTargetWriteMask);
  __return_storage_ptr__->colorWriteMask = VVar4;
  return __return_storage_ptr__;
}

Assistant:

VkPipelineColorBlendAttachmentState RenderTargetBlendDescToVkColorBlendAttachmentState(const RenderTargetBlendDesc& RTBlendDesc)
{
    static const BlendFactorToVkBlendFactorMapper BFtoVKBF;
    static const BlendOperationToVkBlendOp        BOtoVKBO;
    VkPipelineColorBlendAttachmentState           AttachmentBlendState = {};

    AttachmentBlendState.blendEnable         = RTBlendDesc.BlendEnable;
    AttachmentBlendState.srcColorBlendFactor = BFtoVKBF[RTBlendDesc.SrcBlend];
    AttachmentBlendState.dstColorBlendFactor = BFtoVKBF[RTBlendDesc.DestBlend];
    AttachmentBlendState.colorBlendOp        = BOtoVKBO[RTBlendDesc.BlendOp];
    AttachmentBlendState.srcAlphaBlendFactor = BFtoVKBF[RTBlendDesc.SrcBlendAlpha];
    AttachmentBlendState.dstAlphaBlendFactor = BFtoVKBF[RTBlendDesc.DestBlendAlpha];
    AttachmentBlendState.alphaBlendOp        = BOtoVKBO[RTBlendDesc.BlendOpAlpha];
    AttachmentBlendState.colorWriteMask      = ColorMaskToVkColorComponentFlags(RTBlendDesc.RenderTargetWriteMask);

    return AttachmentBlendState;
}